

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

Token * __thiscall wabt::WastLexer::GetStringToken(Token *__return_storage_ptr__,WastLexer *this)

{
  byte bVar1;
  byte *pbVar2;
  Location loc;
  bool bVar3;
  uint uVar4;
  byte *pbVar5;
  uint c;
  bool bVar6;
  bool bVar7;
  byte *pbVar8;
  uint32_t digit;
  char *local_b8;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  if (this->cursor_ < this->buffer_end_) {
    this->cursor_ = this->cursor_ + 1;
  }
  local_b8 = this->token_start_;
  bVar3 = true;
  bVar7 = false;
  bVar6 = bVar7;
LAB_00171790:
  while( true ) {
    while( true ) {
      if (!bVar3) {
        this->token_start_ = local_b8;
        if (bVar6) {
          GetLocation(this);
          loc.filename._M_str._0_4_ = (int)uStack_48;
          loc.filename._M_len = local_50;
          loc.filename._M_str._4_4_ = (int)((ulong)uStack_48 >> 0x20);
          loc.field_1.field_0.line = (int)local_40;
          loc.field_1.field_0.first_column = (int)((ulong)local_40 >> 0x20);
          loc.field_1.field_0.last_column = (int)uStack_38;
          loc.field_1._12_4_ = (int)((ulong)uStack_38 >> 0x20);
          Token::Token(__return_storage_ptr__,loc,First);
        }
        else {
          TextToken(__return_storage_ptr__,this,Text,0);
        }
        return __return_storage_ptr__;
      }
      pbVar2 = (byte *)this->buffer_end_;
      pbVar5 = (byte *)this->cursor_;
      if (pbVar2 <= pbVar5) {
        BareToken(__return_storage_ptr__,this,Eof);
        return __return_storage_ptr__;
      }
      pbVar8 = pbVar5 + 1;
      this->cursor_ = (char *)pbVar8;
      bVar1 = *pbVar5;
      if (bVar1 != 10) break;
      this->token_start_ = (char *)pbVar5;
      GetLocation(this);
      Error(this,0x1df52d);
      this->line_ = this->line_ + 1;
      this->line_start_ = this->cursor_;
      bVar7 = true;
    }
    bVar6 = bVar7;
    if (bVar1 != 0x22) break;
    bVar3 = false;
    if ((pbVar5 + 1 < pbVar2) && (bVar3 = false, pbVar5[1] == 0x22)) {
      GetLocation(this);
      bVar3 = false;
      Error(this,0x1df53f);
      bVar7 = true;
      bVar6 = bVar7;
    }
  }
  if (bVar1 != 0x5c) goto LAB_001718aa;
  if (pbVar8 < pbVar2) {
    pbVar8 = pbVar5 + 2;
    this->cursor_ = (char *)pbVar8;
    uVar4 = pbVar5[1] - 0x22;
    if (0x3a < uVar4) goto LAB_0017185d;
    if ((0x1f80ffc000U >> ((ulong)uVar4 & 0x3f) & 1) == 0) goto code_r0x00171843;
    goto LAB_00171875;
  }
  goto LAB_00171991;
code_r0x00171843:
  bVar3 = true;
  if ((0x400000000000021U >> ((ulong)uVar4 & 0x3f) & 1) != 0) goto LAB_00171790;
LAB_0017185d:
  uVar4 = pbVar5[1] - 0x61;
  if (uVar4 < 0x15) {
    if ((0x3fU >> (uVar4 & 0x1f) & 1) == 0) {
      bVar3 = true;
      if ((0xa2000U >> (uVar4 & 0x1f) & 1) != 0) goto LAB_00171790;
      if (uVar4 == 0x14) {
        this->token_start_ = (char *)pbVar5;
        if (pbVar8 < pbVar2) {
          pbVar8 = pbVar5 + 3;
          this->cursor_ = (char *)pbVar8;
          if (pbVar5[2] == 0x7b) {
            uVar4 = 0;
            do {
              c = 0xffffffff;
              if (this->cursor_ < this->buffer_end_) {
                c = (uint)(byte)*this->cursor_;
              }
              bVar3 = IsHexDigit(c);
              pbVar8 = (byte *)this->cursor_;
              if (!bVar3) {
                if ((this->buffer_end_ <= pbVar8) || (*pbVar8 != 0x7d)) goto LAB_00171a0e;
                if (((uVar4 & 0x1ff800) != 0xd800) && ((byte *)this->token_start_ != pbVar8 + -3))
                goto LAB_001718aa;
                pbVar8 = pbVar8 + 1;
                this->cursor_ = (char *)pbVar8;
                goto LAB_00171a0e;
              }
              this->cursor_ = (char *)(pbVar8 + 1);
              ParseHexdigit(*pbVar8,&digit);
              uVar4 = uVar4 << 4 | digit;
            } while (uVar4 < 0x110000);
            pbVar8 = (byte *)this->cursor_;
LAB_00171a0e:
            pbVar5 = (byte *)this->token_start_;
          }
        }
        goto LAB_00171999;
      }
    }
    else {
LAB_00171875:
      uVar4 = 0xffffffff;
      if (pbVar8 < pbVar2) {
        uVar4 = (uint)*pbVar8;
      }
      bVar3 = IsHexDigit(uVar4);
      pbVar8 = (byte *)this->cursor_;
      if (bVar3) {
        bVar3 = true;
        if (pbVar8 < this->buffer_end_) {
          this->cursor_ = (char *)(pbVar8 + 1);
LAB_001718aa:
          bVar3 = true;
        }
        goto LAB_00171790;
      }
    }
  }
LAB_00171991:
  pbVar5 = pbVar8 + -2;
  this->token_start_ = (char *)pbVar5;
LAB_00171999:
  GetLocation(this);
  Error(this,0x1df554,(char *)(ulong)(uint)((int)pbVar8 - (int)pbVar5));
  bVar3 = true;
  bVar7 = true;
  bVar6 = bVar7;
  goto LAB_00171790;
}

Assistant:

Token WastLexer::GetStringToken() {
  const char* saved_token_start = token_start_;
  bool has_error = false;
  bool in_string = true;
  ReadChar();
  while (in_string) {
    switch (ReadChar()) {
      case kEof:
        return BareToken(TokenType::Eof);

      case '\n':
        token_start_ = cursor_ - 1;
        ERROR("newline in string");
        has_error = true;
        Newline();
        continue;

      case '"':
        if (PeekChar() == '"') {
          ERROR("invalid string token");
          has_error = true;
        }
        in_string = false;
        break;

      case '\\': {
        switch (ReadChar()) {
          case 't':
          case 'n':
          case 'r':
          case '"':
          case '\'':
          case '\\':
            // Valid escape.
            break;

          case '0':
          case '1':
          case '2':
          case '3':
          case '4':
          case '5':
          case '6':
          case '7':
          case '8':
          case '9':
          case 'a':
          case 'b':
          case 'c':
          case 'd':
          case 'e':
          case 'f':
          case 'A':
          case 'B':
          case 'C':
          case 'D':
          case 'E':
          case 'F':  // Hex byte escape.
            if (IsHexDigit(PeekChar())) {
              ReadChar();
            } else {
              token_start_ = cursor_ - 2;
              goto error;
            }
            break;

          case 'u': {
            token_start_ = cursor_ - 2;
            if (ReadChar() != '{') {
              goto error;
            }

            // Value must be a valid unicode scalar value.
            uint32_t digit;
            uint32_t scalar_value = 0;

            while (IsHexDigit(PeekChar())) {
              ParseHexdigit(*cursor_++, &digit);

              scalar_value = (scalar_value << 4) | digit;
              // Maximum value of a unicode code point.
              if (scalar_value >= 0x110000) {
                goto error;
              }
            }

            if (PeekChar() != '}') {
              goto error;
            }

            // Scalars between 0xd800 and 0xdfff are not allowed.
            if ((scalar_value >= 0xd800 && scalar_value < 0xe000) ||
                token_start_ == cursor_ - 3) {
              ReadChar();
              goto error;
            }
            break;
          }

          default:
            token_start_ = cursor_ - 2;
            goto error;

          error:
            ERROR("bad escape \"%.*s\"",
                  static_cast<int>(cursor_ - token_start_), token_start_);
            has_error = true;
            break;
        }
        break;
      }
    }
  }
  token_start_ = saved_token_start;
  if (has_error) {
    return Token(GetLocation(), TokenType::Invalid);
  }

  return TextToken(TokenType::Text);
}